

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hydengine.cpp
# Opt level: O0

bool __thiscall HydEngine::isPressureDeficient(HydEngine *this)

{
  bool bVar1;
  uint uVar2;
  int iVar3;
  vector<Node_*,_std::allocator<Node_*>_> *this_00;
  reference ppNVar4;
  ostream *poVar5;
  Node *node;
  iterator __end1;
  iterator __begin1;
  vector<Node_*,_std::allocator<Node_*>_> *__range1;
  int count;
  HydEngine *this_local;
  
  __range1._4_4_ = 0;
  this_00 = &this->network->nodes;
  __end1 = std::vector<Node_*,_std::allocator<Node_*>_>::begin(this_00);
  node = (Node *)std::vector<Node_*,_std::allocator<Node_*>_>::end(this_00);
  while (bVar1 = __gnu_cxx::operator!=
                           (&__end1,(__normal_iterator<Node_**,_std::vector<Node_*,_std::allocator<Node_*>_>_>
                                     *)&node), bVar1) {
    ppNVar4 = __gnu_cxx::__normal_iterator<Node_**,_std::vector<Node_*,_std::allocator<Node_*>_>_>::
              operator*(&__end1);
    uVar2 = (*((*ppNVar4)->super_Element)._vptr_Element[9])(*ppNVar4,this->network);
    if ((uVar2 & 1) != 0) {
      __range1._4_4_ = __range1._4_4_ + 1;
    }
    __gnu_cxx::__normal_iterator<Node_**,_std::vector<Node_*,_std::allocator<Node_*>_>_>::operator++
              (&__end1);
  }
  if ((0 < __range1._4_4_) && (iVar3 = Network::option(this->network,REPORT_TRIALS), iVar3 != 0)) {
    poVar5 = std::operator<<((ostream *)&this->network->msgLog,"\n\n    ");
    poVar5 = (ostream *)std::ostream::operator<<(poVar5,__range1._4_4_);
    std::operator<<(poVar5,(string *)s_Deficient_abi_cxx11_);
  }
  return 0 < __range1._4_4_;
}

Assistant:

bool HydEngine::isPressureDeficient()
{
    int count = 0;
    for (Node* node : network->nodes)
    {
        // ... This only gets evaluated for the CONSTRAINED demand model
        if ( node->isPressureDeficient(network) ) count++;
    }
    if ( count > 0 && network->option(Options::REPORT_TRIALS) )
    {
        network->msgLog << "\n\n    " << count << s_Deficient;
    }
    return (count > 0);
}